

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzmatredstructmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZFMatrix<double>,_double,_TPZStructMatrixOR<double>_>
::TPZMatRedStructMatrix
          (TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZFMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           *this)

{
  *(undefined8 *)&this->field_0xb0 = 0x181cb68;
  *(undefined4 *)&this->field_0xb8 = 0;
  this->field_0xbc = 1;
  memset(this,0,0xa0);
  TPZStructMatrixT<double>::TPZStructMatrixT
            ((TPZStructMatrixT<double> *)this,&PTR_construction_vtable_104__0181bc28);
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)&this->field_0xa0,&PTR_construction_vtable_104__0181bc58);
  *(undefined8 *)&this->field_0xb0 = 0x181bbb0;
  *(undefined8 *)this = 0x181b9f0;
  *(undefined8 *)&this->field_0xa0 = 0x181bab0;
  return;
}

Assistant:

TPZMatRedStructMatrix<TStructMatrix,TSparseMatrix,TVar,TPar>::TPZMatRedStructMatrix() : TPZStructMatrixT<TVar>()
{
}